

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

void __thiscall
Population::Population(Population *this,DataStorage *data,double mutationRate,size_t populationSize)

{
  _Rb_tree_header *p_Var1;
  pointer pDVar2;
  DNA *dna;
  pointer this_00;
  vector<DNA,_std::allocator<DNA>_> *__range1;
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  local_60;
  
  this->data_ = data;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->mutationRate_ = mutationRate;
  this->answerReady = false;
  p_Var1 = &(this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header;
  (this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->answer).schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->answer).fitness = 0.0;
  std::vector<DNA,_std::allocator<DNA>_>::resize(&this->population_,populationSize);
  this_00 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
            super__Vector_impl_data._M_start;
  pDVar2 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pDVar2) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      Schedule::GenerateRandomSchedule((Schedule *)&local_60,this->data_);
      std::
      _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
      ::clear((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
               *)this_00);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_60._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header;
        (this_00->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      std::
      _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_60);
      this_00 = this_00 + 1;
    } while (this_00 != pDVar2);
  }
  calcFitness(this);
  return;
}

Assistant:

Population::Population(const DataStorage& data, double mutationRate, size_t populationSize)
        : data_(data), mutationRate_(mutationRate), answerReady(false) {

    population_.resize(populationSize);
    for (DNA& dna : population_) {
        dna.schedule = Schedule::GenerateRandomSchedule(data_);
    }

    calcFitness();
}